

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O2

void __thiscall
cppnet::EpollEventActions::OnEvent
          (EpollEventActions *this,vector<epoll_event,_std::allocator<epoll_event>_> *event_vec,
          int16_t num)

{
  pointer peVar1;
  long lVar2;
  _func_int **pp_Var3;
  uint uVar4;
  SingletonLogger *pSVar5;
  ssize_t sVar6;
  int iVar7;
  undefined6 in_register_00000012;
  ulong uVar8;
  long lVar9;
  shared_ptr<cppnet::RWSocket> sVar10;
  shared_ptr<cppnet::Socket> sock;
  shared_ptr<cppnet::RWSocket> rw_sock;
  char buf [4];
  LogStreamParam local_60;
  
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar7 = (int)CONCAT62(in_register_00000012,num);
  if (num < 1) {
    iVar7 = 0;
  }
  uVar8 = 0;
  for (lVar9 = 0; (long)iVar7 * 0xc != lVar9; lVar9 = lVar9 + 0xc) {
    peVar1 = (event_vec->super__Vector_base<epoll_event,_std::allocator<epoll_event>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(uint32_t *)((long)&peVar1->data + lVar9) == this->_pipe[0]) {
      pSVar5 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Warn
                (pSVar5,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                 ,0x132,"weak up the IO thread, index : %d",uVar8);
      sVar6 = read(this->_pipe[0],buf,1);
      if (sVar6 < 1) {
        pSVar5 = Singleton<cppnet::SingletonLogger>::Instance();
        SingletonLogger::GetStreamParam
                  (&local_60,pSVar5,LL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                   ,0x139);
        LogStream::LogStream((LogStream *)&rw_sock,&local_60);
        LogStream::operator<<((LogStream *)&rw_sock,"read from pipe failed when weak up.");
        LogStream::~LogStream((LogStream *)&rw_sock);
        std::pair<std::shared_ptr<cppnet::Log>,_std::function<void_(std::shared_ptr<cppnet::Log>)>_>
        ::~pair(&local_60);
      }
    }
    else {
      lVar2 = *(long *)((long)&peVar1->data + lVar9);
      std::__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> *)&rw_sock,lVar2 + 0x18);
      std::__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> *)&rw_sock);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pSVar5 = Singleton<cppnet::SingletonLogger>::Instance();
        SingletonLogger::Warn
                  (pSVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                   ,0x141,"EPOLL weak up but socket already destroy, index : %d",uVar8);
      }
      else {
        if ((*(byte *)(lVar2 + 0x10) & 4) == 0) {
          sVar10 = std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>
                             ((shared_ptr<cppnet::Socket> *)&rw_sock);
          uVar4 = *(uint *)((long)&((event_vec->
                                    super__Vector_base<epoll_event,_std::allocator<epoll_event>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->events + lVar9);
          if ((uVar4 & 1) != 0) {
            pp_Var3 = ((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Socket)._vptr_Socket;
            if ((uVar4 >> 0xd & 1) == 0) {
              (*pp_Var3[0xe])(rw_sock.
                              super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,0);
            }
            else {
              (*pp_Var3[0x11])(rw_sock.
                               super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,1,sVar10.
                                        super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi._M_pi);
            }
          }
          uVar4 = *(uint *)((long)&((event_vec->
                                    super__Vector_base<epoll_event,_std::allocator<epoll_event>_>).
                                    _M_impl.super__Vector_impl_data._M_start)->events + lVar9);
          if ((uVar4 & 4) != 0) {
            (*((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Socket)._vptr_Socket[0xf])
                      (rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0);
            uVar4 = *(uint *)((long)&((event_vec->
                                      super__Vector_base<epoll_event,_std::allocator<epoll_event>_>)
                                      ._M_impl.super__Vector_impl_data._M_start)->events + lVar9);
          }
          if ((uVar4 & 0x10) != 0) {
            (*((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Socket)._vptr_Socket[0x11])
                      (rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,1);
          }
        }
        else {
          std::dynamic_pointer_cast<cppnet::ConnectSocket,cppnet::Socket>
                    ((shared_ptr<cppnet::Socket> *)&rw_sock);
          (*((rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_Socket)._vptr_Socket[6])();
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&rw_sock.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sock.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void EpollEventActions::OnEvent(std::vector<epoll_event>& event_vec, int16_t num) {
    std::shared_ptr<Socket> sock;
    Event* event = nullptr;

    for (int i = 0; i < num; i++) {
        if ((uint32_t)event_vec[i].data.fd == _pipe[0]) {
            LOG_WARN("weak up the IO thread, index : %d", i);
            char buf[4];
#ifdef __win__
            if (recv(_pipe[0], buf, 1, 0) <= 0) {
#else
            if (read(_pipe[0], buf, 1) <= 0) {
#endif
                LOG_ERROR_S << "read from pipe failed when weak up.";
            }
            continue;
        }

        event = (Event*)event_vec[i].data.ptr;
        sock = event->GetSocket();
        if (!sock) {
            LOG_WARN("EPOLL weak up but socket already destroy, index : %d", i);
            continue;
        }

        // accept event
        if (event->GetType() & ET_ACCEPT) {
            std::shared_ptr<ConnectSocket> connect_sock = std::dynamic_pointer_cast<ConnectSocket>(sock);
            connect_sock->OnAccept();

        } else {
            std::shared_ptr<RWSocket> rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
            if (event_vec[i].events & EPOLLIN) {
                // close
                if (event_vec[i].events & EPOLLRDHUP) {
                    rw_sock->OnDisConnect(CEC_CLOSED);
                    
                } else {
                    rw_sock->OnRead();
                }
            }

            if (event_vec[i].events & EPOLLOUT) {
                rw_sock->OnWrite();
            }

            if (event_vec[i].events & EPOLLHUP) {
                rw_sock->OnDisConnect(CEC_CLOSED);
            }
        }
    }
}

bool EpollEventActions::AddEvent(epoll_event* ev, int32_t event_flag, uint64_t sock, bool in_actions) {
    //if not add to EPOLL
    if (!(ev->events & event_flag)) {
#ifdef __win__
        ev->events |= event_flag;
#else
        if (__epoll_use_et) {
            ev->events |= event_flag | EPOLLET;

        } else {
             ev->events |= event_flag;
        }
#if LINUX_VERSION_CODE >= KERNEL_VERSION(4,5,0)
        if (__epoll_exclusive) {
            ev->events |= EPOLLEXCLUSIVE;
        }
#endif
#endif

        int32_t ret = 0;
        if (in_actions) {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_MOD, sock, ev);

        } else {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_ADD, sock, ev);
        }
            
        if (ret == 0) {
            return true;
        }
        LOG_ERROR("modify event to EPOLL failed! error :%d, sock: %d", errno, sock);
    }
    return false;
}

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}

#ifdef __win__
bool EpollEventActions::Pipe(SOCKET fd[2]) {
        SOCKET listener = socket(AF_INET, SOCK_STREAM, 0);
    if (listener < 0)
        return false;

    struct sockaddr_in listen_addr;
    memset(&listen_addr, 0, sizeof(listen_addr));
    listen_addr.sin_family = AF_INET;
    listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
    listen_addr.sin_port = 0;	/* kernel chooses port.	 */
    if (bind(listener, (struct sockaddr *) &listen_addr, sizeof(listen_addr)) == -1) {
        return false;
    }
    if (listen(listener, 1) == -1) {
        return false;
    }
    SOCKET connector = socket(AF_INET, SOCK_STREAM, 0);
    if (connector < 0) {
        return false;
    }

    /* We want to find out the port number to connect to.  */
    struct sockaddr_in connect_addr;
    int size = sizeof(connect_addr);
    if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
        
    if (size != sizeof(connect_addr)) {
        return false;
    }

    if (connect(connector, (struct sockaddr *) &connect_addr, sizeof(connect_addr)) == -1) {
        return false;
    }

    size = sizeof(listen_addr);
    SOCKET acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
    if (acceptor < 0) {
        return false;
    }
    if (size != sizeof(listen_addr)) {
        return false;
    }

    // check options
    if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
    if (size != sizeof(connect_addr)
        || listen_addr.sin_family != connect_addr.sin_family
        || listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
        || listen_addr.sin_port != connect_addr.sin_port) {
        return false;
    }
    closesocket(listener);

    fd[0] = connector;
    fd[1] = acceptor;
    return true;
}
#endif

}